

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

bool __thiscall re2::Regexp::ParseState::PushDollar(ParseState *this)

{
  ParseFlags PVar1;
  ParseFlags PVar2;
  bool ret;
  ParseFlags oflags;
  ParseState *this_local;
  
  PVar1 = operator&(this->flags_,OneLine);
  if (PVar1 == NoParseFlags) {
    this_local._7_1_ = PushSimpleOp(this,kRegexpEndLine);
  }
  else {
    PVar1 = this->flags_;
    PVar2 = operator|(this->flags_,WasDollar);
    this->flags_ = PVar2;
    this_local._7_1_ = PushSimpleOp(this,kRegexpEndText);
    this->flags_ = PVar1;
  }
  return this_local._7_1_;
}

Assistant:

bool Regexp::ParseState::PushDollar() {
  if (flags_ & OneLine) {
    // Clumsy marker so that MimicsPCRE() can tell whether
    // this kRegexpEndText was a $ and not a \z.
    Regexp::ParseFlags oflags = flags_;
    flags_ = flags_ | WasDollar;
    bool ret = PushSimpleOp(kRegexpEndText);
    flags_ = oflags;
    return ret;
  }
  return PushSimpleOp(kRegexpEndLine);
}